

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

make_caster<std::__cxx11::basic_string<char>_> *
pybind11::detail::load_type<std::__cxx11::string>(handle *handle)

{
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_RSI;
  make_caster<std::__cxx11::basic_string<char>_> *in_RDI;
  make_caster<std::__cxx11::basic_string<char>_> *conv;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 *)0x2517b4);
  load_type<std::__cxx11::string,void>(in_RSI,(handle *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

make_caster<T> load_type(const handle &handle) {
    make_caster<T> conv;
    load_type(conv, handle);
    return conv;
}